

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O2

int __thiscall
QAccessibleMenuBar::indexOfChild(QAccessibleMenuBar *this,QAccessibleInterface *child)

{
  int iVar1;
  QMenuBar *pQVar2;
  QWidget *this_00;
  QObject *object;
  qsizetype qVar3;
  int iVar4;
  long in_FS_OFFSET;
  QAction *local_40;
  QArrayDataPointer<QAction_*> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = (**(code **)(*(long *)child + 0x78))(child);
  iVar4 = -1;
  if ((iVar1 == 0x15) || (iVar1 == 0xc)) {
    pQVar2 = menuBar(this);
    if (pQVar2 != (QMenuBar *)0x0) {
      this_00 = &menuBar(this)->super_QWidget;
      QWidget::actions((QList<QAction_*> *)&local_38,this_00);
      object = (QObject *)(**(code **)(*(long *)child + 0x18))(child);
      local_40 = QtPrivate::qobject_cast_helper<QAction*,QObject>(object);
      qVar3 = QtPrivate::indexOf<QAction*,QAction*>((QList<QAction_*> *)&local_38,&local_40,0);
      iVar4 = (int)qVar3;
      QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return iVar4;
  }
  __stack_chk_fail();
}

Assistant:

int QAccessibleMenuBar::indexOfChild(const QAccessibleInterface *child) const
{
    QAccessible::Role r = child->role();
    if ((r == QAccessible::MenuItem || r == QAccessible::Separator) && menuBar()) {
        return menuBar()->actions().indexOf(qobject_cast<QAction*>(child->object()));
    }
    return -1;
}